

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

void __thiscall
pbrt::HairBxDF::HairBxDF
          (HairBxDF *this,Float h,Float eta,SampledSpectrum *sigma_a,Float beta_m,Float beta_n,
          Float alpha)

{
  undefined1 auVar1 [16];
  enable_if_t<std::is_floating_point<float>::value,_bool> eVar2;
  undefined8 *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  double dVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Float in_XMM4_Da;
  int unaff_retaddr;
  char *in_stack_00000008;
  LogLevel in_stack_00000014;
  int i;
  int p;
  float in_stack_ffffffffffffffb4;
  int local_2c;
  int local_28;
  float *fmt;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  *in_RDI = in_XMM0_Da;
  fmt = in_RDI;
  fVar3 = SafeASin(0.0);
  in_RDI[1] = fVar3;
  in_RDI[2] = in_XMM1_Da;
  *(undefined8 *)(in_RDI + 3) = *in_RSI;
  *(undefined8 *)(in_RDI + 5) = in_RSI[1];
  in_RDI[7] = in_XMM2_Da;
  in_RDI[8] = in_XMM3_Da;
  if ((in_XMM0_Da < -1.0) || (1.0 < in_XMM0_Da)) {
    LogFatal<char_const(&)[18]>
              (in_stack_00000014,in_stack_00000008,unaff_retaddr,(char *)fmt,
               (char (*) [18])CONCAT44(in_XMM0_Da,in_XMM1_Da));
  }
  if ((in_XMM2_Da < 0.0) || (1.0 < in_XMM2_Da)) {
    LogFatal<char_const(&)[27]>
              (in_stack_00000014,in_stack_00000008,unaff_retaddr,(char *)fmt,
               (char (*) [27])CONCAT44(in_XMM0_Da,in_XMM1_Da));
  }
  if ((in_XMM3_Da < 0.0) || (1.0 < in_XMM3_Da)) {
    LogFatal<char_const(&)[27]>
              (in_stack_00000014,in_stack_00000008,unaff_retaddr,(char *)fmt,
               (char (*) [27])CONCAT44(in_XMM0_Da,in_XMM1_Da));
  }
  fVar3 = Sqr<float>(in_XMM2_Da);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f39db23),0),ZEXT416((uint)in_XMM2_Da),
                           ZEXT416((uint)(fVar3 * 0.812)));
  auVar6._0_4_ = Pow<20>(in_stack_ffffffffffffffb4);
  auVar6._4_60_ = extraout_var;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x406ccccd),0),auVar6._0_16_,ZEXT416(auVar1._0_4_));
  fVar3 = Sqr<float>(auVar1._0_4_);
  in_RDI[9] = fVar3;
  in_RDI[10] = in_RDI[9] * 0.25;
  in_RDI[0xb] = in_RDI[9] * 4.0;
  for (local_28 = 3; local_28 < 4; local_28 = local_28 + 1) {
    in_RDI[(long)local_28 + 9] = in_RDI[0xb];
  }
  fVar3 = Sqr<float>(in_XMM3_Da);
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3e87ae14),0),ZEXT416((uint)in_XMM3_Da),
                           ZEXT416((uint)(fVar3 * 1.194)));
  auVar7._0_4_ = Pow<22>(in_stack_ffffffffffffffb4);
  auVar7._4_60_ = extraout_var_00;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40abe76d),0),auVar7._0_16_,ZEXT416(auVar1._0_4_));
  in_RDI[0xd] = auVar1._0_4_ * 0.62665707;
  eVar2 = IsNaN<float>(0.0);
  if (!eVar2) {
    auVar8._0_4_ = Radians(in_XMM4_Da);
    auVar8._4_60_ = extraout_var_01;
    dVar5 = std::sin(auVar8._0_8_);
    in_RDI[0xe] = SUB84(dVar5,0);
    Sqr<float>(in_RDI[0xe]);
    fVar3 = SafeSqrt(0.0);
    in_RDI[0x11] = fVar3;
    for (local_2c = 1; local_2c < 3; local_2c = local_2c + 1) {
      in_RDI[(long)local_2c + 0xe] =
           in_RDI[(long)(local_2c + -1) + 0x11] * 2.0 * in_RDI[(long)(local_2c + -1) + 0xe];
      fVar3 = Sqr<float>(in_RDI[(long)(local_2c + -1) + 0x11]);
      fVar4 = Sqr<float>(in_RDI[(long)(local_2c + -1) + 0xe]);
      in_RDI[(long)local_2c + 0x11] = fVar3 - fVar4;
    }
    return;
  }
  LogFatal<char_const(&)[10]>
            (in_stack_00000014,in_stack_00000008,unaff_retaddr,(char *)fmt,
             (char (*) [10])CONCAT44(in_XMM0_Da,in_XMM1_Da));
}

Assistant:

HairBxDF::HairBxDF(Float h, Float eta, const SampledSpectrum &sigma_a, Float beta_m,
                   Float beta_n, Float alpha)
    : h(h),
      gamma_o(SafeASin(h)),
      eta(eta),
      sigma_a(sigma_a),
      beta_m(beta_m),
      beta_n(beta_n) {
    CHECK(h >= -1 && h <= 1);
    CHECK(beta_m >= 0 && beta_m <= 1);
    CHECK(beta_n >= 0 && beta_n <= 1);
    // Compute longitudinal variance from $\beta_m$
    static_assert(pMax >= 3,
                  "Longitudinal variance code must be updated to handle low pMax");
    v[0] = Sqr(0.726f * beta_m + 0.812f * Sqr(beta_m) + 3.7f * Pow<20>(beta_m));
    v[1] = .25 * v[0];
    v[2] = 4 * v[0];
    for (int p = 3; p <= pMax; ++p)
        // TODO: is there anything better here?
        v[p] = v[2];

    // Compute azimuthal logistic scale factor from $\beta_n$
    static const Float SqrtPiOver8 = 0.626657069f;
    s = SqrtPiOver8 * (0.265f * beta_n + 1.194f * Sqr(beta_n) + 5.372f * Pow<22>(beta_n));
    CHECK(!IsNaN(s));

    // Compute $\alpha$ terms for hair scales
    sin2kAlpha[0] = std::sin(Radians(alpha));
    cos2kAlpha[0] = SafeSqrt(1 - Sqr(sin2kAlpha[0]));
    for (int i = 1; i < 3; ++i) {
        sin2kAlpha[i] = 2 * cos2kAlpha[i - 1] * sin2kAlpha[i - 1];
        cos2kAlpha[i] = Sqr(cos2kAlpha[i - 1]) - Sqr(sin2kAlpha[i - 1]);
    }
}